

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *
Catch::splitStringRef(StringRef str,char delimiter)

{
  char cVar1;
  size_type sVar2;
  char in_CL;
  StringRef *in_RDI;
  size_t pos;
  size_t start;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *subStrings;
  value_type *in_stack_ffffffffffffff68;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *in_stack_ffffffffffffff70;
  StringRef *this;
  size_type in_stack_ffffffffffffff80;
  size_type start_00;
  StringRef *this_00;
  size_type local_30;
  ulong local_28;
  StringRef local_18;
  
  this_00 = in_RDI;
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::vector
            ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)0x12ecac);
  local_28 = 0;
  local_30 = 0;
  while (start_00 = local_30, sVar2 = StringRef::size(&local_18), start_00 < sVar2) {
    cVar1 = StringRef::operator[](&local_18,local_30);
    if (cVar1 == in_CL) {
      if (1 < local_30 - local_28) {
        StringRef::substr(this_00,start_00,in_stack_ffffffffffffff80);
        clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::push_back
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      local_28 = local_30 + 1;
    }
    local_30 = local_30 + 1;
  }
  sVar2 = StringRef::size(&local_18);
  if (local_28 < sVar2) {
    this = &local_18;
    StringRef::size(this);
    StringRef::substr(this_00,start_00,local_28);
    clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::push_back
              ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)this,
               in_stack_ffffffffffffff68);
  }
  return (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)in_RDI;
}

Assistant:

std::vector<StringRef> splitStringRef( StringRef str, char delimiter ) {
        std::vector<StringRef> subStrings;
        std::size_t start = 0;
        for(std::size_t pos = 0; pos < str.size(); ++pos ) {
            if( str[pos] == delimiter ) {
                if( pos - start > 1 )
                    subStrings.push_back( str.substr( start, pos-start ) );
                start = pos+1;
            }
        }
        if( start < str.size() )
            subStrings.push_back( str.substr( start, str.size()-start ) );
        return subStrings;
    }